

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O0

void __thiscall
test_cpp_db_sqlite::test_transaction_commit::~test_transaction_commit(test_transaction_commit *this)

{
  test_transaction_commit *this_local;
  
  SQLiteTestFixture::~SQLiteTestFixture(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_transaction_commit)
{
    cpp_db::transaction tran(*con);
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::statement("select count(*) from TEST_TABLE", *con).execute_scalar()), 3);

    BOOST_CHECK_NO_THROW(tran.begin());
    cpp_db::statement stmt(*con);
    BOOST_CHECK_NO_THROW(stmt.prepare("delete from TEST_TABLE where COL1 = ?"));
    BOOST_CHECK_NO_THROW(stmt.execute_non_query(2));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::statement("select count(*) from TEST_TABLE", *con).execute_scalar()), 2);
    BOOST_CHECK_NO_THROW(tran.commit());
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::statement("select count(*) from TEST_TABLE", *con).execute_scalar()), 2);
}